

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sentencepiece_model.pb.cc
# Opt level: O1

uint8 * __thiscall
sentencepiece::ModelProto_SentencePiece::_InternalSerialize
          (ModelProto_SentencePiece *this,uint8 *target,EpsCopyOutputStream *stream)

{
  uint uVar1;
  float fVar2;
  void *pvVar3;
  void *pvVar4;
  bool bVar5;
  ulong uVar6;
  ulong uVar7;
  uint8 *puVar8;
  undefined8 *puVar9;
  size_t __n;
  
  uVar1 = (this->_has_bits_).has_bits_[0];
  if ((uVar1 & 1) != 0) {
    target = google::protobuf::io::EpsCopyOutputStream::WriteStringMaybeAliased
                       (stream,1,(string *)
                                 ((ulong)(this->piece_).tagged_ptr_.ptr_ & 0xfffffffffffffffe),
                        target);
  }
  if ((uVar1 & 2) != 0) {
    if (stream->end_ <= target) {
      target = google::protobuf::io::EpsCopyOutputStream::EnsureSpaceFallback(stream,target);
    }
    fVar2 = this->score_;
    *target = '\x15';
    *(float *)(target + 1) = fVar2;
    target = target + 5;
  }
  if ((uVar1 & 4) != 0) {
    if (stream->end_ <= target) {
      target = google::protobuf::io::EpsCopyOutputStream::EnsureSpaceFallback(stream,target);
    }
    uVar1 = this->type_;
    *target = '\x18';
    if ((ulong)(long)(int)uVar1 < 0x80) {
      target[1] = (byte)uVar1;
      target = target + 2;
    }
    else {
      target[1] = (byte)uVar1 | 0x80;
      uVar6 = (ulong)(long)(int)uVar1 >> 7;
      if (uVar1 < 0x4000) {
        target[2] = (uint8)uVar6;
        target = target + 3;
      }
      else {
        target = target + 3;
        do {
          puVar8 = target;
          puVar8[-1] = (byte)uVar6 | 0x80;
          uVar7 = uVar6 >> 7;
          target = puVar8 + 1;
          bVar5 = 0x3fff < uVar6;
          uVar6 = uVar7;
        } while (bVar5);
        *puVar8 = (uint8)uVar7;
      }
    }
  }
  puVar8 = google::protobuf::internal::ExtensionSet::_InternalSerialize
                     (&this->_extensions_,200,0x20000000,target,stream);
  pvVar3 = (this->super_MessageLite)._internal_metadata_.ptr_;
  if (((ulong)pvVar3 & 1) != 0) {
    pvVar3 = *(void **)(((ulong)pvVar3 & 0xfffffffffffffffe) + 8);
    pvVar4 = (this->super_MessageLite)._internal_metadata_.ptr_;
    if (((ulong)pvVar4 & 1) == 0) {
      puVar9 = &google::protobuf::internal::fixed_address_empty_string;
      if ((google::protobuf::internal::init_protobuf_defaults_state & 1) == 0) {
        google::protobuf::internal::InitProtobufDefaultsSlow();
      }
    }
    else {
      puVar9 = (undefined8 *)(((ulong)pvVar4 & 0xfffffffffffffffe) + 8);
    }
    __n = (size_t)(int)puVar9[1];
    if ((long)stream->end_ - (long)puVar8 < (long)__n) {
      puVar8 = google::protobuf::io::EpsCopyOutputStream::WriteRawFallback
                         (stream,pvVar3,(int)puVar9[1],puVar8);
      return puVar8;
    }
    memcpy(puVar8,pvVar3,__n);
    puVar8 = puVar8 + __n;
  }
  return puVar8;
}

Assistant:

::PROTOBUF_NAMESPACE_ID::uint8* ModelProto_SentencePiece::_InternalSerialize(
    ::PROTOBUF_NAMESPACE_ID::uint8* target, ::PROTOBUF_NAMESPACE_ID::io::EpsCopyOutputStream* stream) const {
  // @@protoc_insertion_point(serialize_to_array_start:sentencepiece.ModelProto.SentencePiece)
  ::PROTOBUF_NAMESPACE_ID::uint32 cached_has_bits = 0;
  (void) cached_has_bits;

  cached_has_bits = _has_bits_[0];
  // optional string piece = 1;
  if (cached_has_bits & 0x00000001u) {
    target = stream->WriteStringMaybeAliased(
        1, this->_internal_piece(), target);
  }

  // optional float score = 2;
  if (cached_has_bits & 0x00000002u) {
    target = stream->EnsureSpace(target);
    target = ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::WriteFloatToArray(2, this->_internal_score(), target);
  }

  // optional .sentencepiece.ModelProto.SentencePiece.Type type = 3 [default = NORMAL];
  if (cached_has_bits & 0x00000004u) {
    target = stream->EnsureSpace(target);
    target = ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::WriteEnumToArray(
      3, this->_internal_type(), target);
  }

  // Extension range [200, 536870912)
  target = _extensions_._InternalSerialize(
      200, 536870912, target, stream);

  if (PROTOBUF_PREDICT_FALSE(_internal_metadata_.have_unknown_fields())) {
    target = stream->WriteRaw(_internal_metadata_.unknown_fields<std::string>(::PROTOBUF_NAMESPACE_ID::internal::GetEmptyString).data(),
        static_cast<int>(_internal_metadata_.unknown_fields<std::string>(::PROTOBUF_NAMESPACE_ID::internal::GetEmptyString).size()), target);
  }
  // @@protoc_insertion_point(serialize_to_array_end:sentencepiece.ModelProto.SentencePiece)
  return target;
}